

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_api.c
# Opt level: O0

void assert_that_compiles(void)

{
  undefined8 uVar1;
  
  uVar1 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
               ,0x10,"1 == 1",1,uVar1);
  uVar1 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
               ,0x11,"1 == 1",1,uVar1);
  uVar1 = create_equal_to_value_constraint(1,"1");
  assert_that_double_(0x3ff0000000000000,
                      "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/api/core_api.c"
                      ,0x12,"1",uVar1);
  significant_figures_for_assert_double_are(3);
  return;
}

Assistant:

Ensure(assert_that_compiles) {
    assert_that(1 == 1);
    assert_that(1 == 1, is_true);
    assert_that_double(1, is_equal_to(1));
    significant_figures_for_assert_double_are(3);
}